

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat.c
# Opt level: O0

int repeat_segment_mix(mixed_segment *segment)

{
  uint local_40;
  uint32_t local_3c;
  uint32_t i;
  uint32_t samples;
  float *out;
  float *in;
  float *buf;
  uint32_t index;
  uint32_t repeat_samples;
  repeat_segment_data *data;
  mixed_segment *segment_local;
  
  _index = (undefined8 *)segment->data;
  buf._4_4_ = *(uint *)(_index + 3);
  buf._0_4_ = *(uint *)((long)_index + 0x1c);
  in = (float *)_index[2];
  local_3c = 0xffffffff;
  if (*(int *)(_index + 5) == 3) {
    local_3c = buf._4_4_ - (uint)buf;
  }
  data = (repeat_segment_data *)segment;
  mixed_buffer_request_read(&out,&local_3c,(mixed_buffer *)*_index);
  mixed_buffer_request_write((float **)&i,&local_3c,(mixed_buffer *)_index[1]);
  for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
    in[(uint)buf] =
         in[(uint)buf] *
         (1.0 - (float)*(uint *)((long)_index + 0x2c) / (float)*(uint *)(_index + 6)) +
         out[local_40] * ((float)*(uint *)((long)_index + 0x2c) / (float)*(uint *)(_index + 6));
    if (*(int *)(_index + 5) == 2) {
      if (*(int *)((long)_index + 0x2c) != 0) {
        *(int *)((long)_index + 0x2c) = *(int *)((long)_index + 0x2c) + -1;
      }
    }
    else if (*(uint *)((long)_index + 0x2c) < *(uint *)(_index + 6)) {
      *(int *)((long)_index + 0x2c) = *(int *)((long)_index + 0x2c) + 1;
    }
    _i[local_40] = in[(uint)buf];
    buf._0_4_ = ((uint)buf + 1) % buf._4_4_;
  }
  mixed_buffer_finish_read(local_3c,(mixed_buffer *)*_index);
  mixed_buffer_finish_write(local_3c,(mixed_buffer *)_index[1]);
  if (((*(int *)(_index + 5) == 3) && ((uint)buf == 0)) && (local_3c != 0)) {
    *(undefined4 *)(_index + 5) = 2;
  }
  *(uint *)((long)_index + 0x1c) = (uint)buf;
  return 1;
}

Assistant:

int repeat_segment_mix(struct mixed_segment *segment){
  struct repeat_segment_data *data = (struct repeat_segment_data *)segment->data;

  uint32_t repeat_samples = data->buffer_size;
  uint32_t index = data->buffer_index;
  float *restrict buf = data->buffer;

  float *restrict in, *restrict out;
  uint32_t samples = UINT32_MAX;
  if (data->mode == MIXED_RECORD_ONCE) {
    samples = repeat_samples - index;
  }

  mixed_buffer_request_read(&in, &samples, data->in);
  mixed_buffer_request_write(&out, &samples, data->out);
  for(uint32_t i=0; i<samples; ++i){
    buf[index] = LERP(buf[index], in[i], data->fade_position/(float)data->fade_length);
    if (data->mode == MIXED_PLAY) {
      if (data->fade_position > 0) {
        data->fade_position--;
      }
    } else {
      if (data->fade_position < data->fade_length) {
        data->fade_position++;
      }
    }
    out[i] = buf[index];
    index = (index+1)%repeat_samples;
  }
  mixed_buffer_finish_read(samples, data->in);
  mixed_buffer_finish_write(samples, data->out);

  if (data->mode == MIXED_RECORD_ONCE && index == 0 && samples > 0) {
    data->mode = MIXED_PLAY;
  }

  data->buffer_index = index;
  return 1;
}